

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O2

void anon_unknown.dwarf_e0046::readFile
               (string *filename,int channelCount,bool bulkRead,bool randomChannels)

{
  float fVar1;
  int iVar2;
  PixelType PVar3;
  PixelType PVar4;
  bool bVar5;
  char cVar6;
  __type _Var7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Box<Imath_3_2::Vec2<int>_> *pBVar12;
  Box<Imath_3_2::Vec2<int>_> *pBVar13;
  float *pfVar14;
  float *pfVar15;
  int *piVar16;
  ChannelList *this;
  ChannelList *pCVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ulong uVar18;
  ostream *poVar19;
  void *pvVar20;
  void **ppvVar21;
  int iVar22;
  undefined7 in_register_00000009;
  int iVar23;
  long lVar24;
  long lVar25;
  int k_1;
  ulong uVar26;
  long lVar27;
  char *pcVar28;
  long lVar29;
  int j_2;
  int iVar30;
  int j;
  long lVar31;
  ulong uVar32;
  int k;
  ulong uVar33;
  uint uVar34;
  long lVar35;
  float fVar36;
  Array<Imf_3_2::Array2D<void_*>_> data;
  long local_300;
  Array2D<unsigned_int> localSampleCount;
  int local_2d0;
  DeepScanLineInputFile file;
  vector<int,_std::allocator<int>_> read_channel;
  int local_280;
  string str;
  DeepFrameBuffer frameBuffer;
  DeepSlice local_1f0 [56];
  stringstream ss;
  undefined1 local_1a8 [376];
  
  pcVar28 = " reading all channels ";
  if ((int)CONCAT71(in_register_00000009,randomChannels) != 0) {
    pcVar28 = " reading random channels ";
  }
  std::operator<<((ostream *)&std::cout,pcVar28);
  std::ostream::flush();
  Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile(&file,(filename->_M_dataplus)._M_p,8);
  Imf_3_2::DeepScanLineInputFile::header();
  pBVar12 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
  pBVar13 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
  bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar12,pBVar13);
  if (!bVar5) {
    __assert_fail("fileHeader.displayWindow () == header.displayWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x109,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pBVar12 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
  pBVar13 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
  bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar12,pBVar13);
  if (!bVar5) {
    __assert_fail("fileHeader.dataWindow () == header.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10a,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar14 = (float *)Imf_3_2::Header::pixelAspectRatio();
  fVar36 = *pfVar14;
  pfVar14 = (float *)Imf_3_2::Header::pixelAspectRatio();
  if ((fVar36 != *pfVar14) || (NAN(fVar36) || NAN(*pfVar14))) {
    __assert_fail("fileHeader.pixelAspectRatio () == header.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10b,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar14 = (float *)Imf_3_2::Header::screenWindowCenter();
  pfVar15 = (float *)Imf_3_2::Header::screenWindowCenter();
  if ((((*pfVar14 != *pfVar15) || (NAN(*pfVar14) || NAN(*pfVar15))) || (pfVar14[1] != pfVar15[1]))
     || (NAN(pfVar14[1]) || NAN(pfVar15[1]))) {
    __assert_fail("fileHeader.screenWindowCenter () == header.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10c,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar14 = (float *)Imf_3_2::Header::screenWindowWidth();
  fVar36 = *pfVar14;
  pfVar14 = (float *)Imf_3_2::Header::screenWindowWidth();
  if ((fVar36 != *pfVar14) || (NAN(fVar36) || NAN(*pfVar14))) {
    __assert_fail("fileHeader.screenWindowWidth () == header.screenWindowWidth ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10d,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  piVar16 = (int *)Imf_3_2::Header::lineOrder();
  iVar10 = *piVar16;
  piVar16 = (int *)Imf_3_2::Header::lineOrder();
  if (iVar10 != *piVar16) {
    __assert_fail("fileHeader.lineOrder () == header.lineOrder ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10e,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  piVar16 = (int *)Imf_3_2::Header::compression();
  iVar10 = *piVar16;
  piVar16 = (int *)Imf_3_2::Header::compression();
  if (iVar10 != *piVar16) {
    __assert_fail("fileHeader.compression () == header.compression ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10f,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  this = (ChannelList *)Imf_3_2::Header::channels();
  pCVar17 = (ChannelList *)Imf_3_2::Header::channels();
  cVar6 = Imf_3_2::ChannelList::operator==(this,pCVar17);
  if (cVar6 == '\0') {
    __assert_fail("fileHeader.channels () == header.channels ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x110,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          Imf_3_2::Header::type_abi_cxx11_();
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          Imf_3_2::Header::type_abi_cxx11_();
  _Var7 = std::operator==(__lhs,__rhs);
  if (!_Var7) {
    __assert_fail("fileHeader.type () == header.type ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x111,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  piVar16 = (int *)Imf_3_2::Header::dataWindow();
  iVar10 = piVar16[2];
  iVar2 = *piVar16;
  lVar24 = ((long)iVar10 - (long)iVar2) + 1;
  iVar23 = piVar16[3];
  iVar11 = piVar16[1];
  lVar29 = ((long)iVar23 - (long)iVar11) + 1;
  localSampleCount._sizeX = 0;
  localSampleCount._sizeY = 0;
  localSampleCount._data = (uint *)0x0;
  Imf_3_2::Array2D<unsigned_int>::resizeErase(&localSampleCount,lVar29,lVar24);
  uVar8 = random_int(3);
  uVar34 = uVar8 + channelCount;
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array(&data,(long)(int)uVar34);
  uVar33 = 0;
  uVar18 = (ulong)uVar34;
  if ((int)uVar34 < 1) {
    uVar18 = uVar33;
  }
  for (; uVar18 * 0x18 - uVar33 != 0; uVar33 = uVar33 + 0x18) {
    Imf_3_2::Array2D<void_*>::resizeErase
              ((Array2D<void_*> *)((long)&(data._data)->_sizeX + uVar33),lVar29,lVar24);
  }
  Imf_3_2::DeepFrameBuffer::DeepFrameBuffer(&frameBuffer);
  iVar22 = (int)lVar24;
  lVar29 = (long)iVar22;
  Imf_3_2::Slice::Slice
            ((Slice *)&ss,UINT,
             (char *)(localSampleCount._data + (-(long)*piVar16 - piVar16[1] * lVar29)),4,lVar24 * 4
             ,1,1,0.0,false,false);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  std::vector<int,_std::allocator<int>_>::vector
            (&read_channel,(ulong)(uint)channelCount,(allocator_type *)&ss);
  uVar33 = 0;
  uVar18 = 0;
  if (0 < channelCount) {
    uVar18 = (ulong)(uint)channelCount;
  }
  lVar24 = 0x10;
  iVar30 = 0;
  do {
    if (uVar18 == uVar33) {
      if (iVar30 == 0) {
        std::operator<<((ostream *)&std::cout,"skipping ");
        std::ostream::flush();
      }
      else {
        lVar24 = (long)channelCount;
        uVar26 = 0;
        uVar33 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar33 = uVar26;
        }
        lVar25 = lVar24 * 0x18;
        for (; uVar33 != uVar26; uVar26 = uVar26 + 1) {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar19 = (ostream *)std::ostream::operator<<(local_1a8,(int)uVar26);
          std::operator<<(poVar19,"fill");
          std::__cxx11::stringbuf::str();
          Imf_3_2::DeepSlice::DeepSlice
                    (local_1f0,FLOAT,
                     (char *)(*(long *)((long)&(data._data)->_data + lVar25) + (long)*piVar16 * -8 +
                             piVar16[1] * lVar29 * -8),8,(long)(iVar22 * 8),4,1,1,0.0,false,false);
          Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&str);
          std::__cxx11::string::~string((string *)&str);
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          lVar25 = lVar25 + 0x18;
        }
        Imf_3_2::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)&file);
        local_2d0 = (int)((long)iVar10 - (long)iVar2);
        if (bulkRead) {
          std::operator<<((ostream *)&std::cout,"bulk ");
          std::ostream::flush();
          Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts((int)&file,piVar16[1]);
          lVar29 = 0;
          for (lVar25 = 0; lVar25 <= piVar16[3] - piVar16[1]; lVar25 = lVar25 + 1) {
            lVar31 = 0;
            while (lVar31 <= local_2d0) {
              lVar35 = lVar31 * 4;
              lVar27 = lVar31 * 4;
              lVar31 = lVar31 + 1;
              if (*(int *)((long)localSampleCount._data + lVar35 + localSampleCount._sizeY * lVar29)
                  != *(int *)((anonymous_namespace)::sampleCount._8_8_ * lVar29 +
                              (anonymous_namespace)::sampleCount._16_8_ + lVar27)) {
                __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                              ,0x16f,
                              "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                             );
              }
            }
            for (lVar31 = 0; lVar31 <= local_2d0; lVar31 = lVar31 + 1) {
              lVar27 = localSampleCount._sizeY * lVar25;
              lVar35 = 4;
              for (uVar26 = 0; uVar18 != uVar26; uVar26 = uVar26 + 1) {
                if (((ulong)localSampleCount._data[lVar27 + lVar31] == 0) ||
                   ((randomChannels &&
                    (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar26] != 1)))) {
                  pvVar20 = (void *)0x0;
LAB_001472b1:
                  *(void **)(*(long *)((long)data._data + lVar35 * 4 + -8) * lVar25 * 8 +
                             *(long *)((long)&(data._data)->_sizeX + lVar35 * 4) + lVar31 * 8) =
                       pvVar20;
                }
                else {
                  iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar26 * 4);
                  if (iVar10 == 0) {
                    pvVar20 = operator_new__((ulong)localSampleCount._data[lVar27 + lVar31] << 2);
                    *(void **)(*(long *)((long)data._data + lVar35 * 4 + -8) * lVar25 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar35 * 4) + lVar31 * 8) =
                         pvVar20;
                    iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar26 * 4);
                  }
                  if (iVar10 == 1) {
                    pvVar20 = operator_new__((ulong)localSampleCount._data[lVar27 + lVar31] * 2);
                    *(void **)(*(long *)((long)data._data + lVar35 * 4 + -8) * lVar25 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar35 * 4) + lVar31 * 8) =
                         pvVar20;
                    iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar26 * 4);
                  }
                  if (iVar10 == 2) {
                    pvVar20 = operator_new__((ulong)localSampleCount._data[lVar27 + lVar31] << 2);
                    goto LAB_001472b1;
                  }
                }
                lVar35 = lVar35 + 6;
              }
              lVar27 = localSampleCount._sizeY * lVar25;
              uVar26 = uVar33;
              lVar35 = lVar24 * 0x18 + 0x10;
              while (bVar5 = uVar26 != 0, uVar26 = uVar26 - 1, bVar5) {
                pvVar20 = operator_new__((ulong)localSampleCount._data[lVar27 + lVar31] << 2);
                *(void **)(*(long *)((long)data._data + lVar35 + -8) * lVar25 * 8 +
                           *(long *)((long)&(data._data)->_sizeX + lVar35) + lVar31 * 8) = pvVar20;
                lVar35 = lVar35 + 0x18;
              }
            }
            lVar29 = lVar29 + 4;
          }
          Imf_3_2::DeepScanLineInputFile::readPixels((int)&file,piVar16[1]);
        }
        else {
          std::operator<<((ostream *)&std::cout,"per-line ");
          std::ostream::flush();
          lVar29 = 0;
          for (lVar25 = 0; lVar25 <= (long)piVar16[3] - (long)piVar16[1]; lVar25 = lVar25 + 1) {
            Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts((int)&file);
            lVar31 = 0;
            while (lVar31 <= local_2d0) {
              lVar35 = lVar31 * 4;
              lVar27 = lVar31 * 4;
              lVar31 = lVar31 + 1;
              if (*(int *)((long)localSampleCount._data + lVar35 + localSampleCount._sizeY * lVar29)
                  != *(int *)((anonymous_namespace)::sampleCount._8_8_ * lVar29 +
                              (anonymous_namespace)::sampleCount._16_8_ + lVar27)) {
                __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                              ,0x199,
                              "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                             );
              }
            }
            for (lVar31 = 0; lVar31 <= local_2d0; lVar31 = lVar31 + 1) {
              lVar27 = localSampleCount._sizeY * lVar25;
              lVar35 = 4;
              for (uVar26 = 0; uVar18 != uVar26; uVar26 = uVar26 + 1) {
                if (((ulong)localSampleCount._data[lVar27 + lVar31] == 0) ||
                   ((randomChannels &&
                    (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar26] != 1)))) {
                  pvVar20 = (void *)0x0;
LAB_0014753e:
                  *(void **)(*(long *)((long)data._data + lVar35 * 4 + -8) * lVar25 * 8 +
                             *(long *)((long)&(data._data)->_sizeX + lVar35 * 4) + lVar31 * 8) =
                       pvVar20;
                }
                else {
                  iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar26 * 4);
                  if (iVar10 == 0) {
                    pvVar20 = operator_new__((ulong)localSampleCount._data[lVar27 + lVar31] << 2);
                    *(void **)(*(long *)((long)data._data + lVar35 * 4 + -8) * lVar25 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar35 * 4) + lVar31 * 8) =
                         pvVar20;
                    iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar26 * 4);
                  }
                  if (iVar10 == 1) {
                    pvVar20 = operator_new__((ulong)localSampleCount._data[lVar27 + lVar31] * 2);
                    *(void **)(*(long *)((long)data._data + lVar35 * 4 + -8) * lVar25 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar35 * 4) + lVar31 * 8) =
                         pvVar20;
                    iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar26 * 4);
                  }
                  if (iVar10 == 2) {
                    pvVar20 = operator_new__((ulong)localSampleCount._data[lVar27 + lVar31] << 2);
                    goto LAB_0014753e;
                  }
                }
                lVar35 = lVar35 + 6;
              }
              lVar27 = localSampleCount._sizeY * lVar25;
              lVar35 = lVar24 * 0x18 + 0x10;
              uVar26 = uVar33;
              while (bVar5 = uVar26 != 0, uVar26 = uVar26 - 1, bVar5) {
                pvVar20 = operator_new__((ulong)localSampleCount._data[lVar27 + lVar31] << 2);
                *(void **)(*(long *)((long)data._data + lVar35 + -8) * lVar25 * 8 +
                           *(long *)((long)&(data._data)->_sizeX + lVar35) + lVar31 * 8) = pvVar20;
                lVar35 = lVar35 + 0x18;
              }
            }
            Imf_3_2::DeepScanLineInputFile::readPixels((int)&file);
            lVar29 = lVar29 + 4;
          }
        }
        local_300 = (long)local_2d0;
        local_280 = (int)((long)iVar23 - (long)iVar11);
        for (lVar29 = 0; lVar29 <= local_280; lVar29 = lVar29 + 1) {
          iVar10 = (int)lVar29;
          for (lVar25 = 0; lVar25 <= local_300; lVar25 = lVar25 + 1) {
            iVar2 = (int)lVar25;
            uVar8 = iVar2 + iVar10 * iVar22;
            uVar34 = uVar8 % 0x801;
            iVar23 = (int)uVar8 % 0x801;
            fVar36 = (float)iVar23;
            for (uVar26 = 0; uVar26 != uVar18; uVar26 = uVar26 + 1) {
              if ((!randomChannels) ||
                 (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar26] == 1)) {
                for (uVar32 = 0;
                    uVar32 < *(uint *)((anonymous_namespace)::sampleCount._8_8_ * lVar29 * 4 +
                                       (anonymous_namespace)::sampleCount._16_8_ + lVar25 * 4);
                    uVar32 = uVar32 + 1) {
                  iVar11 = *(int *)((anonymous_namespace)::channelTypes + uVar26 * 4);
                  if (iVar11 == 0) {
                    pvVar20 = data._data[uVar26]._data[data._data[uVar26]._sizeY * lVar29 + lVar25];
                    if (*(uint *)((long)pvVar20 + uVar32 * 4) != uVar34) {
                      poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
                      poVar19 = std::operator<<(poVar19,", ");
                      poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar10);
                      poVar19 = std::operator<<(poVar19," error, should be ");
                      poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar23);
                      poVar19 = std::operator<<(poVar19,", is ");
                      poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
                      std::endl<char,std::char_traits<char>>(poVar19);
                      std::ostream::flush();
                      if (*(uint *)((long)pvVar20 + uVar32 * 4) != uVar34) {
                        __assert_fail("value[l] == static_cast<unsigned int> (i * width + j) % 2049"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                                      ,0x1d0,
                                      "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                     );
                      }
                    }
                    iVar11 = *(int *)((anonymous_namespace)::channelTypes + uVar26 * 4);
                  }
                  if (iVar11 == 1) {
                    ppvVar21 = data._data[uVar26]._data;
                    lVar31 = data._data[uVar26]._sizeY * lVar29;
                    pvVar20 = ppvVar21[lVar31 + lVar25];
                    fVar1 = *(float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)((long)pvVar20 + uVar32 * 2) * 4);
                    if ((fVar1 != fVar36) || (NAN(fVar1) || NAN(fVar36))) {
                      poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
                      poVar19 = std::operator<<(poVar19,", ");
                      poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar10);
                      poVar19 = std::operator<<(poVar19," error, should be ");
                      poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar23);
                      poVar19 = std::operator<<(poVar19,", is ");
                      poVar19 = (ostream *)
                                ::operator<<(poVar19,(half)*(uint16_t *)((long)pvVar20 + uVar32 * 2)
                                            );
                      std::endl<char,std::char_traits<char>>(poVar19);
                      std::ostream::flush();
                      ppvVar21 = data._data[uVar26]._data;
                      lVar31 = data._data[uVar26]._sizeY * lVar29;
                    }
                    fVar1 = *(float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)
                                              ((long)ppvVar21[lVar31 + lVar25] + uVar32 * 2) * 4);
                    if ((fVar1 != fVar36) || (NAN(fVar1) || NAN(fVar36))) {
                      __assert_fail("((half*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                                    ,0x1dc,
                                    "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                   );
                    }
                    iVar11 = *(int *)((anonymous_namespace)::channelTypes + uVar26 * 4);
                  }
                  if (iVar11 == 2) {
                    ppvVar21 = data._data[uVar26]._data;
                    lVar31 = data._data[uVar26]._sizeY * lVar29;
                    pvVar20 = ppvVar21[lVar31 + lVar25];
                    fVar1 = *(float *)((long)pvVar20 + uVar32 * 4);
                    if ((fVar1 != fVar36) || (NAN(fVar1) || NAN(fVar36))) {
                      poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
                      poVar19 = std::operator<<(poVar19,", ");
                      poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar10);
                      poVar19 = std::operator<<(poVar19," error, should be ");
                      poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar23);
                      poVar19 = std::operator<<(poVar19,", is ");
                      poVar19 = (ostream *)
                                std::ostream::operator<<
                                          (poVar19,*(float *)((long)pvVar20 + uVar32 * 4));
                      std::endl<char,std::char_traits<char>>(poVar19);
                      std::ostream::flush();
                      ppvVar21 = data._data[uVar26]._data;
                      lVar31 = data._data[uVar26]._sizeY * lVar29;
                    }
                    fVar1 = *(float *)((long)ppvVar21[lVar31 + lVar25] + uVar32 * 4);
                    if ((fVar1 != fVar36) || (NAN(fVar1) || NAN(fVar36))) {
                      __assert_fail("((float*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                                    ,0x1e8,
                                    "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                   );
                    }
                  }
                }
              }
            }
          }
        }
        for (lVar29 = 0; lVar29 <= local_280; lVar29 = lVar29 + 1) {
          for (lVar25 = 0; lVar25 <= local_300; lVar25 = lVar25 + 1) {
            lVar31 = 4;
            for (uVar26 = 0; lVar35 = lVar24 * 0x18 + 0x10, uVar32 = uVar33, uVar18 != uVar26;
                uVar26 = uVar26 + 1) {
              if ((!randomChannels) ||
                 (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar26] == 1)) {
                iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar26 * 4);
                if (iVar10 == 0) {
                  pvVar20 = *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * lVar29 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) +
                                      lVar25 * 8);
                  if (pvVar20 == (void *)0x0) goto LAB_00147a42;
                  operator_delete__(pvVar20);
                  iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar26 * 4);
                }
                if (iVar10 == 1) {
                  pvVar20 = *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * lVar29 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) +
                                      lVar25 * 8);
                  if (pvVar20 == (void *)0x0) goto LAB_00147a42;
                  operator_delete__(pvVar20);
                  iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar26 * 4);
                }
                if ((iVar10 == 2) &&
                   (pvVar20 = *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * lVar29 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) +
                                        lVar25 * 8), pvVar20 != (void *)0x0)) {
                  operator_delete__(pvVar20);
                }
              }
LAB_00147a42:
              lVar31 = lVar31 + 6;
            }
            while (uVar32 != 0) {
              pvVar20 = *(void **)(*(long *)((long)data._data + lVar35 + -8) * lVar29 * 8 +
                                   *(long *)((long)&(data._data)->_sizeX + lVar35) + lVar25 * 8);
              if (pvVar20 != (void *)0x0) {
                operator_delete__(pvVar20);
              }
              lVar35 = lVar35 + 0x18;
              uVar32 = uVar32 - 1;
            }
          }
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&read_channel.super__Vector_base<int,_std::allocator<int>_>);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array(&data);
      Imf_3_2::Array2D<unsigned_int>::~Array2D(&localSampleCount);
      Imf_3_2::DeepScanLineInputFile::~DeepScanLineInputFile(&file);
      return;
    }
    if (randomChannels) {
      iVar9 = random_int(2);
      read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar33] = iVar9;
      if (iVar9 == 1) goto LAB_00146eec;
    }
    else {
LAB_00146eec:
      PVar3 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar33 * 4);
      PVar4 = (uint)(PVar3 != UINT) * 3;
      if (PVar3 == HALF) {
        PVar4 = PVar3;
      }
      if (PVar3 == FLOAT) {
        PVar4 = PVar3;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,(int)uVar33);
      std::__cxx11::stringbuf::str();
      iVar9 = *(int *)((anonymous_namespace)::channelTypes + uVar33 * 4);
      uVar26 = (ulong)(iVar9 == 0) << 2;
      if (iVar9 == 1) {
        uVar26 = 2;
      }
      if (iVar9 == 2) {
        uVar26 = 4;
      }
      Imf_3_2::DeepSlice::DeepSlice
                (local_1f0,PVar4,
                 (char *)(*(long *)((long)&(data._data)->_sizeX + lVar24) + (long)*piVar16 * -8 +
                         piVar16[1] * lVar29 * -8),8,(long)(iVar22 * 8),uVar26,1,1,0.0,false,false);
      Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&str);
      iVar30 = iVar30 + 1;
      std::__cxx11::string::~string((string *)&str);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    uVar33 = uVar33 + 1;
    lVar24 = lVar24 + 0x18;
  } while( true );
}

Assistant:

void
readFile (
    const std::string& filename,
    int                channelCount,
    bool               bulkRead,
    bool               randomChannels)
{
    if (randomChannels) { cout << " reading random channels " << flush; }
    else
    {
        cout << " reading all channels " << flush;
    }

    DeepScanLineInputFile file (filename.c_str (), 8);

    const Header& fileHeader = file.header ();
    assert (fileHeader.displayWindow () == header.displayWindow ());
    assert (fileHeader.dataWindow () == header.dataWindow ());
    assert (fileHeader.pixelAspectRatio () == header.pixelAspectRatio ());
    assert (fileHeader.screenWindowCenter () == header.screenWindowCenter ());
    assert (fileHeader.screenWindowWidth () == header.screenWindowWidth ());
    assert (fileHeader.lineOrder () == header.lineOrder ());
    assert (fileHeader.compression () == header.compression ());
    assert (fileHeader.channels () == header.channels ());
    assert (fileHeader.type () == header.type ());

    const Box2i& dataWindow = fileHeader.dataWindow ();

    int width  = dataWindow.max.x - dataWindow.min.x + 1;
    int height = dataWindow.max.y - dataWindow.min.y + 1;

    Array2D<unsigned int> localSampleCount;
    localSampleCount.resizeErase (height, width);

    // also test filling channels. Generate up to 2 extra channels
    int fillChannels = random_int (3);

    Array<Array2D<void*>> data (channelCount + fillChannels);
    for (int i = 0; i < channelCount + fillChannels; i++)
        data[i].resizeErase (height, width);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT, // type // 7
        (char*) (&localSampleCount[0][0] - dataWindow.min.x - dataWindow.min.y * width), // base // 8)
        sizeof (unsigned int) * 1,       // xStride// 9
        sizeof (unsigned int) * width)); // yStride// 10

    vector<int> read_channel (channelCount);

    int channels_added = 0;

    for (int i = 0; i < channelCount; i++)
    {
        if (randomChannels) { read_channel[i] = random_int (2); }
        if (!randomChannels || read_channel[i] == 1)
        {
            PixelType type = NUM_PIXELTYPES;
            if (channelTypes[i] == 0) type = IMF::UINT;
            if (channelTypes[i] == 1) type = IMF::HALF;
            if (channelTypes[i] == 2) type = IMF::FLOAT;

            stringstream ss;
            ss << i;
            string str = ss.str ();

            int sampleSize = 0;
            if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
            if (channelTypes[i] == 1) sampleSize = sizeof (half);
            if (channelTypes[i] == 2) sampleSize = sizeof (float);

            int pointerSize = sizeof (char*);

            frameBuffer.insert (
                str, // name // 6
                DeepSlice (
                    type, // type // 7
                    (char*) (&data[i][0][0] - dataWindow.min.x - dataWindow.min.y * width), // base // 8)
                    pointerSize * 1,     // xStride// 9
                    pointerSize * width, // yStride// 10
                    sampleSize));        // sampleStride
            channels_added++;
        }
    }

    if (channels_added == 0)
    {
        cout << "skipping " << flush;
        return;
    }
    for (int i = 0; i < fillChannels; ++i)
    {
        PixelType    type        = IMF::FLOAT;
        int          sampleSize  = sizeof (float);
        int          pointerSize = sizeof (char*);
        stringstream ss;
        // generate channel names that aren't in file but (might) interleave with existing file
        ss << i << "fill";
        string str = ss.str ();
        frameBuffer.insert (str,                            // name // 6
                                DeepSlice (type,                    // type // 7
                                (char *) (&data[i+channelCount][0][0]
                                          - dataWindow.min.x
                                          - dataWindow.min.y * width),               // base // 8)
                                pointerSize * 1,          // xStride// 9
                                pointerSize * width,      // yStride// 10
                                sampleSize));             // sampleStride
    }
    file.setFrameBuffer (frameBuffer);

    if (bulkRead)
    {
        cout << "bulk " << flush;
        file.readPixelSampleCounts (dataWindow.min.y, dataWindow.max.y);
        for (int i = 0; i < dataWindow.max.y - dataWindow.min.y + 1; i++)
        {
            for (int j = 0; j < width; j++)
                assert (localSampleCount[i][j] == sampleCount[i][j]);

            for (int j = 0; j < width; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    if (localSampleCount[i][j] > 0 &&
                        (!randomChannels || read_channel[k] == 1))
                    {
                        if (channelTypes[k] == 0)
                            data[k][i][j] =
                                new unsigned int[localSampleCount[i][j]];
                        if (channelTypes[k] == 1)
                            data[k][i][j] = new half[localSampleCount[i][j]];
                        if (channelTypes[k] == 2)
                            data[k][i][j] = new float[localSampleCount[i][j]];
                    }
                    else
                    {
                        data[k][i][j] = nullptr;
                    }
                }
                for (int f = 0; f < fillChannels; ++f)
                {
                    data[f + channelCount][i][j] =
                        new float[localSampleCount[i][j]];
                }
            }
        }

        file.readPixels (dataWindow.min.y, dataWindow.max.y);
    }

    else
    {
        cout << "per-line " << flush;
        for (int i = 0; i < dataWindow.max.y - dataWindow.min.y + 1; i++)
        {
            int y = i + dataWindow.min.y;
            file.readPixelSampleCounts (y);

            for (int j = 0; j < width; j++)
                assert (localSampleCount[i][j] == sampleCount[i][j]);

            for (int j = 0; j < width; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    if (localSampleCount[i][j] > 0 &&
                        (!randomChannels || read_channel[k] == 1))
                    {
                        if (channelTypes[k] == 0)
                            data[k][i][j] =
                                new unsigned int[localSampleCount[i][j]];
                        if (channelTypes[k] == 1)
                            data[k][i][j] = new half[localSampleCount[i][j]];
                        if (channelTypes[k] == 2)
                            data[k][i][j] = new float[localSampleCount[i][j]];
                    }
                    else
                    {
                        data[k][i][j] = nullptr;
                    }
                }
                for (int f = 0; f < fillChannels; ++f)
                {
                    data[f + channelCount][i][j] =
                        new float[localSampleCount[i][j]];
                }
            }

            file.readPixels (y);
        }
    }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if (!randomChannels || read_channel[k] == 1)
                {
                    for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                    {
                        if (channelTypes[k] == 0)
                        {
                            unsigned int* value =
                                (unsigned int*) (data[k][i][j]);
                            if (value[l] !=
                                static_cast<unsigned int> (i * width + j) %
                                    2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is "
                                     << value[l] << endl
                                     << flush;
                            assert (
                                value[l] ==
                                static_cast<unsigned int> (i * width + j) %
                                    2049);
                        }
                        if (channelTypes[k] == 1)
                        {
                            half* value = (half*) (data[k][i][j]);
                            if (value[l] != (i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is "
                                     << value[l] << endl
                                     << flush;
                            assert (
                                ((half*) (data[k][i][j]))[l] ==
                                (i * width + j) % 2049);
                        }
                        if (channelTypes[k] == 2)
                        {
                            float* value = (float*) (data[k][i][j]);
                            if (value[l] != (i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is "
                                     << value[l] << endl
                                     << flush;
                            assert (
                                ((float*) (data[k][i][j]))[l] ==
                                (i * width + j) % 2049);
                        }
                    }
                }
            }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
        {
            for (int k = 0; k < channelCount; k++)
            {
                if (!randomChannels || read_channel[k] == 1)
                {
                    if (channelTypes[k] == 0)
                        delete[](unsigned int*) data[k][i][j];
                    if (channelTypes[k] == 1) delete[](half*) data[k][i][j];
                    if (channelTypes[k] == 2) delete[](float*) data[k][i][j];
                }
            }
            for (int f = 0; f < fillChannels; ++f)
            {
                delete[](float*) data[f + channelCount][i][j];
            }
        }
}